

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O1

string * __thiscall
Diligent::
FormatString<std::__cxx11::string,char[34],Diligent::MemorySizeFormatter<unsigned_long>,char[4],Diligent::MemorySizeFormatter<unsigned_long>,char[3],unsigned_long,char_const*>
          (string *__return_storage_ptr__,Diligent *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args,
          char (*Args_1) [34],MemorySizeFormatter<unsigned_long> *Args_2,char (*Args_3) [4],
          MemorySizeFormatter<unsigned_long> *Args_4,char (*Args_5) [3],unsigned_long *Args_6,
          char **Args_7)

{
  stringstream ss;
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,*(char **)this,*(long *)(this + 8));
  FormatStrSS<std::__cxx11::stringstream,char[34],Diligent::MemorySizeFormatter<unsigned_long>,char[4],Diligent::MemorySizeFormatter<unsigned_long>,char[3],unsigned_long,char_const*>
            (&ss,(char (*) [34])Args,(MemorySizeFormatter<unsigned_long> *)Args_1,
             (char (*) [4])Args_2,(MemorySizeFormatter<unsigned_long> *)Args_3,(char (*) [3])Args_4,
             (unsigned_long *)Args_5,(char **)Args_6);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}